

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscSymbolTable.h
# Opt level: O3

void __thiscall CNscSymbolTable::MakeRoom(CNscSymbolTable *this,size_t nSize)

{
  size_t __n;
  uchar *__src;
  uchar *__dest;
  ulong uVar1;
  
  __n = this->m_nSize;
  uVar1 = this->m_nAllocated;
  if (uVar1 < nSize + __n) {
    do {
      uVar1 = uVar1 + this->m_nGrowSize;
    } while (uVar1 < nSize + __n);
    this->m_nAllocated = uVar1;
    __dest = (uchar *)operator_new__(uVar1);
    if (__n == 0) {
      this->m_nSize = 1;
    }
    else {
      __src = this->m_pauchData;
      memmove(__dest,__src,__n);
      if (__src != (uchar *)0x0) {
        operator_delete__(__src);
      }
    }
    this->m_pauchData = __dest;
  }
  return;
}

Assistant:

void MakeRoom (size_t nSize)
	{
		if (m_nSize + nSize > m_nAllocated)
		{
			do 
			{
				m_nAllocated += m_nGrowSize;
			} while (m_nSize + nSize > m_nAllocated);
			unsigned char *pauchNew = new unsigned char [m_nAllocated];
			if (m_nSize == 0)
				m_nSize = 1;
			else
			{
				memmove (pauchNew, m_pauchData, m_nSize);
				delete [] m_pauchData;
			}
			m_pauchData = pauchNew;
		}
	}